

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O1

void __thiscall
HBT_correlation::combine_and_bin_particle_pairs
          (HBT_correlation *this,vector<int,_std::allocator<int>_> *event_list)

{
  pretty_ostream *ppVar1;
  double *pdVar2;
  double dVar3;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar4;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *pvVar5;
  pointer puVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double __y;
  ostream *this_00;
  long lVar10;
  unsigned_long_long *puVar11;
  long lVar12;
  int iVar13;
  anon_struct_120_15_f999644b *paVar14;
  int iVar15;
  iterator iVar16;
  int iVar17;
  anon_struct_120_15_f999644b *unaff_R12;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  byte bVar23;
  double dVar24;
  double __x;
  double dVar25;
  undefined4 uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  undefined8 uVar35;
  double dVar36;
  undefined8 uVar37;
  double dVar38;
  undefined8 uVar39;
  double dVar40;
  vector<particle_info,_std::allocator<particle_info>_> temp_particle_list;
  anon_struct_120_15_f999644b *local_1c8;
  iterator iStack_1c0;
  anon_struct_120_15_f999644b *local_1b8;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  ostream *local_180;
  double local_178;
  int local_16c;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  double local_150;
  undefined1 local_148 [16];
  double local_138;
  long local_130;
  long local_128;
  long local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  string local_e8;
  string local_c8;
  anon_struct_120_15_f999644b local_a8;
  
  bVar23 = 0;
  local_1c8 = (anon_struct_120_15_f999644b *)0x0;
  iStack_1c0._M_current = (anon_struct_120_15_f999644b *)0x0;
  local_1b8 = (anon_struct_120_15_f999644b *)0x0;
  dVar7 = tanh(this->Krap_max_);
  dVar8 = tanh(this->Krap_min_);
  if (0 < this->number_of_oversample_events_) {
    lVar12 = 0;
    unaff_R12 = &local_a8;
    do {
      iVar20 = (event_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar12];
      pvVar4 = (((this->particle_list).
                 super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                particle_list->
               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start[iVar20];
      uVar19 = (int)((long)*(pointer *)
                            ((long)&pvVar4->
                                    super__Vector_base<particle_info,_std::allocator<particle_info>_>
                            + 8) -
                     *(long *)&pvVar4->
                               super__Vector_base<particle_info,_std::allocator<particle_info>_> >>
                    3) * -0x11111111;
      if (0 < (int)uVar19) {
        uVar21 = (ulong)(uVar19 & 0x7fffffff);
        lVar22 = 0;
        do {
          pvVar5 = ((this->particle_list).
                    super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   particle_list;
          pdVar2 = (double *)
                   (*(long *)&(pvVar5->
                              super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                              )._M_impl.super__Vector_impl_data._M_start[iVar20]->
                              super__Vector_base<particle_info,_std::allocator<particle_info>_> +
                    0x28 + lVar22);
          dVar34 = *pdVar2;
          dVar33 = pdVar2[1];
          dVar24 = dVar34 / dVar33;
          if ((dVar8 < dVar24) && (dVar24 < dVar7)) {
            local_a8.pz = dVar34;
            local_a8.E = dVar33;
            lVar10 = *(long *)&(pvVar5->
                               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                               )._M_impl.super__Vector_impl_data._M_start[iVar20]->
                               super__Vector_base<particle_info,_std::allocator<particle_info>_>;
            local_a8.px = *(double *)(lVar10 + 0x18 + lVar22);
            local_a8.py = *(double *)(lVar10 + 0x20 + lVar22);
            local_a8.mass = *(double *)(lVar10 + 8 + lVar22);
            local_a8.x = *(double *)(lVar10 + 0x38 + lVar22);
            local_a8.y = *(double *)(lVar10 + 0x40 + lVar22);
            local_a8.z = *(double *)(lVar10 + 0x48 + lVar22);
            local_a8.t = *(double *)(lVar10 + 0x50 + lVar22);
            if (iStack_1c0._M_current == local_1b8) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>
                        ((vector<particle_info,std::allocator<particle_info>> *)&local_1c8,
                         iStack_1c0,unaff_R12);
            }
            else {
              paVar14 = unaff_R12;
              iVar16._M_current = iStack_1c0._M_current;
              for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
                uVar26 = *(undefined4 *)&paVar14->field_0x4;
                (iVar16._M_current)->monval = paVar14->monval;
                *(undefined4 *)&(iVar16._M_current)->field_0x4 = uVar26;
                paVar14 = (anon_struct_120_15_f999644b *)((long)paVar14 + (ulong)bVar23 * -0x10 + 8)
                ;
                iVar16._M_current = iVar16._M_current + (ulong)bVar23 * -0x10 + 8;
              }
              iStack_1c0._M_current = iStack_1c0._M_current + 1;
            }
          }
          lVar22 = lVar22 + 0x78;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->number_of_oversample_events_);
  }
  lVar22 = (long)iStack_1c0._M_current - (long)local_1c8;
  ppVar1 = &this->messager;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppVar1,"number of pairs: ",0x11);
  lVar12 = (lVar22 >> 3) * -0x1111111111111111;
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)ppVar1);
  local_180 = (ostream *)ppVar1;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"info","");
  pretty_ostream::flush((pretty_ostream *)local_180,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (0 < lVar22) {
    local_f0 = this->KT_min * this->KT_min;
    local_f8 = this->KT_max * this->KT_max;
    lVar22 = 1;
    local_130 = 1;
    if (1 < lVar12) {
      local_130 = lVar12;
    }
    local_128 = 0;
    do {
      lVar10 = local_128 + 1;
      local_120 = lVar22;
      if (lVar12 - lVar10 != 0 && lVar10 <= lVar12) {
        dVar7 = local_1c8[local_128].px;
        dVar8 = local_1c8[local_128].py;
        local_150 = local_1c8[local_128].pz;
        local_158 = local_1c8[local_128].E;
        local_100 = local_1c8[local_128].x;
        local_108 = local_1c8[local_128].y;
        local_110 = local_1c8[local_128].z;
        local_118 = local_1c8[local_128].t;
        local_128 = lVar10;
        do {
          dVar34 = local_1c8[lVar22].px;
          dVar33 = local_1c8[lVar22].py;
          __x = (dVar7 + dVar34) * 0.5;
          __y = (dVar8 + dVar33) * 0.5;
          dVar24 = __x * __x + __y * __y;
          if ((local_f0 <= dVar24) && (dVar24 <= local_f8)) {
            dVar28 = local_1c8[lVar22].E;
            dVar31 = local_1c8[lVar22].t;
            dVar40 = local_1c8[lVar22].z;
            local_1a8 = local_1c8[lVar22].x;
            dVar3 = local_1c8[lVar22].y;
            local_148._8_8_ = 0;
            local_148._0_8_ = local_1c8[lVar22].pz;
            if (dVar24 < 0.0) {
              dVar24 = sqrt(dVar24);
              dVar32 = (double)local_148._0_8_;
            }
            else {
              dVar24 = SQRT(dVar24);
              dVar32 = local_1c8[lVar22].pz;
            }
            dVar30 = (dVar24 - this->KT_min) / this->dKT;
            dVar34 = dVar7 - dVar34;
            dVar33 = dVar8 - dVar33;
            dVar32 = local_150 - dVar32;
            local_178 = local_158 - dVar28;
            dVar9 = ((local_178 * local_178 - dVar34 * dVar34) - dVar33 * dVar33) - dVar32 * dVar32;
            dVar29 = -dVar9;
            if (-0.0 < dVar9) {
              local_198 = dVar30;
              dVar29 = sqrt(dVar29);
              dVar30 = local_198;
            }
            else {
              dVar29 = SQRT(dVar29);
            }
            iVar20 = (int)dVar30;
            dVar38 = -dVar34;
            uVar39 = 0x8000000000000000;
            dVar36 = -dVar33;
            uVar37 = 0x8000000000000000;
            dVar30 = -dVar32;
            uVar35 = 0x8000000000000000;
            dVar31 = local_118 - dVar31;
            dVar9 = local_100 - local_1a8;
            dVar3 = local_108 - dVar3;
            dVar40 = local_110 - dVar40;
            if (this->invariant_radius_flag_ == 1) {
              puVar6 = (this->number_of_pairs_numerator_KTdiff_qinv_).
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar21 = puVar6[iVar20];
              if (uVar21 < this->needed_number_of_pairs * 0x32) {
                dVar25 = this->delta_q * 0.5;
                dVar27 = this->q_min - dVar25;
                if ((dVar27 + 1e-08 < dVar29) && (dVar29 < dVar25 + this->q_max + -1e-08)) {
                  local_16c = (int)((dVar29 - dVar27) / this->delta_q);
                  puVar6[iVar20] = uVar21 + 1;
                  local_1a8 = dVar30;
                  uStack_1a0 = uVar35;
                  local_198 = dVar36;
                  uStack_190 = uVar37;
                  local_168 = dVar38;
                  uStack_160 = uVar39;
                  local_138 = dVar29;
                  dVar29 = cos((dVar30 * dVar40 +
                               dVar36 * dVar3 + local_178 * dVar31 + dVar9 * dVar38) *
                               5.067728853174532);
                  lVar10 = (long)local_16c;
                  this->correl_1d_inv_num_count[iVar20][lVar10] =
                       this->correl_1d_inv_num_count[iVar20][lVar10] + 1.0;
                  this->q_inv_mean[iVar20][lVar10] = local_138 + this->q_inv_mean[iVar20][lVar10];
                  this->correl_1d_inv_num[iVar20][lVar10] =
                       dVar29 + this->correl_1d_inv_num[iVar20][lVar10];
                  dVar30 = local_1a8;
                  uVar35 = uStack_1a0;
                  dVar36 = local_198;
                  uVar37 = uStack_190;
                  dVar38 = local_168;
                  uVar39 = uStack_160;
                }
              }
            }
            dVar25 = dVar34 * (__x / dVar24) + dVar33 * (__y / dVar24);
            dVar34 = this->delta_q;
            dVar29 = this->q_min - dVar34 * 0.5;
            if ((dVar29 + 1e-08 <= dVar25) &&
               (dVar27 = dVar34 * 0.5 + this->q_max + -1e-08, dVar25 <= dVar27)) {
              iVar18 = (int)((dVar25 - dVar29) / dVar34);
              if ((iVar18 < this->qnpts) &&
                 (((dVar33 = dVar33 * (__x / dVar24) + (__y / dVar24) * dVar38,
                   dVar29 + 1e-08 <= dVar33 && (dVar33 <= dVar27)) &&
                  (iVar13 = (int)((dVar33 - dVar29) / dVar34), iVar13 < this->qnpts)))) {
                if (this->long_comoving_boost == true) {
                  uVar26 = local_148._12_4_;
                  dVar24 = (local_148._0_8_ + local_150) * 0.5;
                  dVar28 = (dVar28 + local_158) * 0.5;
                  dVar34 = dVar28 * dVar28 - dVar24 * dVar24;
                  if (dVar34 < 0.0) {
                    local_148._8_4_ = local_148._8_4_;
                    local_148._0_8_ = dVar24;
                    local_148._12_4_ = uVar26;
                    local_1a8 = dVar30;
                    uStack_1a0 = uVar35;
                    local_198 = dVar36;
                    uStack_190 = uVar37;
                    local_168 = dVar38;
                    uStack_160 = uVar39;
                    dVar34 = sqrt(dVar34);
                    dVar24 = local_148._0_8_;
                    dVar30 = local_1a8;
                    uVar35 = uStack_1a0;
                    dVar36 = local_198;
                    uVar37 = uStack_190;
                    dVar38 = local_168;
                    uVar39 = uStack_160;
                  }
                  else {
                    dVar34 = SQRT(dVar34);
                  }
                  dVar32 = ((-dVar24 / dVar28) * local_178 + dVar32) * (dVar28 / dVar34);
                }
                dVar34 = this->delta_q * 0.5;
                dVar24 = this->q_min - dVar34;
                if (((dVar24 + 1e-08 <= dVar32) && (dVar32 <= dVar34 + this->q_max + -1e-08)) &&
                   (iVar15 = (int)((dVar32 - dVar24) / this->delta_q), iVar15 < this->qnpts)) {
                  if (this->azimuthal_flag_ == 0) {
                    puVar6 = (this->number_of_pairs_numerator_KTdiff).
                             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar21 = puVar6[iVar20];
                    if (uVar21 <= this->needed_number_of_pairs) {
                      puVar11 = puVar6 + iVar20;
LAB_0011eb09:
                      *puVar11 = uVar21 + 1;
                      dVar34 = cos((dVar30 * dVar40 +
                                   dVar36 * dVar3 + local_178 * dVar31 + dVar9 * dVar38) *
                                   5.067728853174532);
                      if (this->azimuthal_flag_ == 0) {
                        this->correl_3d_num_count[iVar20][iVar18][iVar13][iVar15] =
                             this->correl_3d_num_count[iVar20][iVar18][iVar13][iVar15] + 1.0;
                        this->q_out_mean[iVar20][iVar18][iVar13][iVar15] =
                             dVar25 + this->q_out_mean[iVar20][iVar18][iVar13][iVar15];
                        this->q_side_mean[iVar20][iVar18][iVar13][iVar15] =
                             dVar33 + this->q_side_mean[iVar20][iVar18][iVar13][iVar15];
                        this->q_long_mean[iVar20][iVar18][iVar13][iVar15] =
                             dVar32 + this->q_long_mean[iVar20][iVar18][iVar13][iVar15];
                        this->correl_3d_num[iVar20][iVar18][iVar13][iVar15] =
                             dVar34 + this->correl_3d_num[iVar20][iVar18][iVar13][iVar15];
                      }
                      else {
                        iVar17 = (int)unaff_R12;
                        this->correl_3d_Kphi_diff_num_count[iVar20][iVar17][iVar18][iVar13][iVar15]
                             = this->correl_3d_Kphi_diff_num_count[iVar20][iVar17][iVar18][iVar13]
                               [iVar15] + 1.0;
                        this->q_out_diff_mean[iVar20][iVar17][iVar18][iVar13][iVar15] =
                             dVar25 + this->q_out_diff_mean[iVar20][iVar17][iVar18][iVar13][iVar15];
                        this->q_side_diff_mean[iVar20][iVar17][iVar18][iVar13][iVar15] =
                             dVar33 + this->q_side_diff_mean[iVar20][iVar17][iVar18][iVar13][iVar15]
                        ;
                        this->q_long_diff_mean[iVar20][iVar17][iVar18][iVar13][iVar15] =
                             dVar32 + this->q_long_diff_mean[iVar20][iVar17][iVar18][iVar13][iVar15]
                        ;
                        this->correl_3d_Kphi_diff_num[iVar20][iVar17][iVar18][iVar13][iVar15] =
                             dVar34 + this->correl_3d_Kphi_diff_num[iVar20][iVar17][iVar18][iVar13]
                                      [iVar15];
                      }
                    }
                  }
                  else {
                    local_1a8 = dVar30;
                    uStack_1a0 = uVar35;
                    local_198 = dVar36;
                    uStack_190 = uVar37;
                    local_168 = dVar38;
                    uStack_160 = uVar39;
                    dVar34 = atan2(__y,__x);
                    this_00 = local_180;
                    for (dVar34 = dVar34 - this->psi_ref; dVar34 < 0.0;
                        dVar34 = dVar34 + 6.283185307179586) {
                    }
                    for (; 6.283185307179586 < dVar34; dVar34 = dVar34 + -6.283185307179586) {
                    }
                    uVar19 = (uint)(dVar34 / this->dKphi);
                    unaff_R12 = (anon_struct_120_15_f999644b *)(ulong)uVar19;
                    if (((int)uVar19 < 0) || (this->n_Kphi <= (int)uVar19)) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                (local_180,"delta_phi = ",0xc);
                      std::ostream::_M_insert<double>(dVar34);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (this_00," is out of bound of [0, 2pi]! ",0x1e);
                      std::__ostream_insert<char,std::char_traits<char>>(this_00,"Kphi_idx = ",0xb);
                      std::ostream::operator<<(this_00,uVar19);
                      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e8,"warning","");
                      pretty_ostream::flush((pretty_ostream *)local_180,&local_e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                        operator_delete(local_e8._M_dataplus._M_p);
                      }
                    }
                    else {
                      uVar21 = this->number_of_pairs_numerator_KTKphidiff[iVar20][uVar19];
                      if (uVar21 <= this->needed_number_of_pairs) {
                        puVar11 = this->number_of_pairs_numerator_KTKphidiff[iVar20] + uVar19;
                        dVar30 = local_1a8;
                        dVar36 = local_198;
                        dVar38 = local_168;
                        goto LAB_0011eb09;
                      }
                    }
                  }
                }
              }
            }
          }
          lVar22 = lVar22 + 1;
          lVar10 = local_128;
        } while (lVar12 - lVar22 != 0 && lVar22 <= lVar12);
      }
      local_128 = lVar10;
      lVar22 = local_120 + 1;
    } while (local_128 != local_130);
  }
  if (iStack_1c0._M_current != local_1c8) {
    iStack_1c0._M_current = local_1c8;
  }
  if (local_1c8 != (anon_struct_120_15_f999644b *)0x0) {
    operator_delete(local_1c8);
  }
  return;
}

Assistant:

void HBT_correlation::combine_and_bin_particle_pairs(
    std::vector<int> event_list) {
    double hbarC_inv = 1. / hbarC;
    std::vector<particle_info> temp_particle_list;
    double particle_list_rapidity_cut_max = tanh(Krap_max_);
    double particle_list_rapidity_cut_min = tanh(Krap_min_);
    for (int j = 0; j < number_of_oversample_events_; j++) {
        int event_id = event_list[j];
        int event_number_particle =
            (particle_list->get_number_of_particles(event_list[j]));
        for (int i = 0; i < event_number_particle; i++) {
            double temp_E = particle_list->get_particle(event_id, i).E;
            double temp_pz = particle_list->get_particle(event_id, i).pz;
            double temp_ratio = temp_pz / temp_E;
            if (temp_ratio > particle_list_rapidity_cut_min
                && temp_ratio < particle_list_rapidity_cut_max) {
                particle_info temp_particle;
                temp_particle.E = temp_E;
                temp_particle.pz = temp_pz;
                temp_particle.px = particle_list->get_particle(event_id, i).px;
                temp_particle.py = particle_list->get_particle(event_id, i).py;
                temp_particle.mass =
                    (particle_list->get_particle(event_id, i).mass);
                temp_particle.x = particle_list->get_particle(event_id, i).x;
                temp_particle.y = particle_list->get_particle(event_id, i).y;
                temp_particle.z = particle_list->get_particle(event_id, i).z;
                temp_particle.t = particle_list->get_particle(event_id, i).t;
                temp_particle_list.push_back(temp_particle);
            }
        }
    }
    long long int number_of_particles = temp_particle_list.size();
    unsigned long long int number_of_pairs =
        (number_of_particles * (number_of_particles - 1) / 2);

    // nested pair loop
    messager << "number of pairs: " << number_of_pairs;
    messager.flush("info");
    double KT_min_sq = KT_min * KT_min;
    double KT_max_sq = KT_max * KT_max;
    for (int i = 0; i < number_of_particles; i++) {
        double particle_1_px = temp_particle_list[i].px;
        double particle_1_py = temp_particle_list[i].py;
        double particle_1_pz = temp_particle_list[i].pz;
        double particle_1_E = temp_particle_list[i].E;
        double particle_1_x = temp_particle_list[i].x;
        double particle_1_y = temp_particle_list[i].y;
        double particle_1_z = temp_particle_list[i].z;
        double particle_1_t = temp_particle_list[i].t;

        for (int j = i + 1; j < number_of_particles; j++) {
            double particle_2_px = temp_particle_list[j].px;
            double particle_2_py = temp_particle_list[j].py;
            double particle_2_pz = temp_particle_list[j].pz;
            double particle_2_E = temp_particle_list[j].E;
            double particle_2_x = temp_particle_list[j].x;
            double particle_2_y = temp_particle_list[j].y;
            double particle_2_z = temp_particle_list[j].z;
            double particle_2_t = temp_particle_list[j].t;

            double K_z = 0.5 * (particle_1_pz + particle_2_pz);
            double K_E = 0.5 * (particle_1_E + particle_2_E);
            double K_z_over_K_E = K_z / K_E;

            // K_T cut
            double K_x = 0.5 * (particle_1_px + particle_2_px);
            double K_y = 0.5 * (particle_1_py + particle_2_py);
            double K_perp_sq = K_x * K_x + K_y * K_y;
            if (K_perp_sq < KT_min_sq || K_perp_sq > KT_max_sq) {
                continue;
            }

            double K_perp = sqrt(K_perp_sq);
            int Kperp_idx = static_cast<int>((K_perp - KT_min) / dKT);

            // calculate q_inv
            double q_x = particle_1_px - particle_2_px;
            double q_y = particle_1_py - particle_2_py;
            double q_z = particle_1_pz - particle_2_pz;
            double q_E = particle_1_E - particle_2_E;
            double local_q_inv =
                sqrt(-(q_E * q_E - q_x * q_x - q_y * q_y - q_z * q_z));

            double t_diff = particle_1_t - particle_2_t;
            double x_diff = particle_1_x - particle_2_x;
            double y_diff = particle_1_y - particle_2_y;
            double z_diff = particle_1_z - particle_2_z;

            if (invariant_radius_flag_ == 1) {
                if (number_of_pairs_numerator_KTdiff_qinv_[Kperp_idx]
                    < 50 * needed_number_of_pairs) {
                    if (local_q_inv > (q_min - delta_q / 2. + 1e-8)
                        && local_q_inv < (q_max + delta_q / 2. - 1e-8)) {
                        int qinv_idx = static_cast<int>(
                            (local_q_inv - (q_min - delta_q / 2.)) / delta_q);
                        number_of_pairs_numerator_KTdiff_qinv_[Kperp_idx]++;
                        double cos_qx =
                            cos(hbarC_inv
                                * (q_E * t_diff - q_x * x_diff - q_y * y_diff
                                   - q_z * z_diff));
                        correl_1d_inv_num_count[Kperp_idx][qinv_idx]++;
                        q_inv_mean[Kperp_idx][qinv_idx] += local_q_inv;
                        correl_1d_inv_num[Kperp_idx][qinv_idx] += cos_qx;
                    }
                }
            }

            // calculate qout and qside in lcms
            double cos_K_phi = K_x / K_perp;
            double sin_K_phi = K_y / K_perp;

            double local_q_out = q_x * cos_K_phi + q_y * sin_K_phi;
            if (local_q_out < (q_min - delta_q / 2. + 1e-8)
                || local_q_out > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }

            int qout_idx = static_cast<int>(
                (local_q_out - (q_min - delta_q / 2.)) / delta_q);
            if (qout_idx >= qnpts) continue;

            double local_q_side = q_y * cos_K_phi - q_x * sin_K_phi;
            if (local_q_side < (q_min - delta_q / 2. + 1e-8)
                || local_q_side > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }

            int qside_idx = static_cast<int>(
                (local_q_side - (q_min - delta_q / 2.)) / delta_q);
            if (qside_idx >= qnpts) continue;

            double local_q_long = q_z;
            if (long_comoving_boost) {
                // calcualte qlong in the lcms
                double Mt = sqrt(K_E * K_E - K_z * K_z);
                double boost_gamma = K_E / Mt;
                double boost_beta = K_z_over_K_E;
                // boost qz to lcms
                local_q_long = boost_gamma * (q_z - boost_beta * q_E);
            }

            if (local_q_long < (q_min - delta_q / 2. + 1e-8)
                || local_q_long > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }
            int qlong_idx = static_cast<int>(
                (local_q_long - (q_min - delta_q / 2.)) / delta_q);
            if (qlong_idx >= qnpts) continue;

            int Kphi_idx;
            if (azimuthal_flag_ == 0) {
                if (number_of_pairs_numerator_KTdiff[Kperp_idx]
                    > needed_number_of_pairs) {
                    continue;
                }
                number_of_pairs_numerator_KTdiff[Kperp_idx]++;
            } else {
                double local_K_phi = atan2(K_y, K_x);
                double delta_phi = local_K_phi - psi_ref;
                while (delta_phi < 0.) {
                    delta_phi += 2. * M_PI;
                }
                while (delta_phi > 2. * M_PI) {
                    delta_phi -= 2. * M_PI;
                }
                Kphi_idx = static_cast<int>(delta_phi / dKphi);
                if (Kphi_idx < 0 || Kphi_idx >= n_Kphi) {
                    messager << "delta_phi = " << delta_phi
                             << " is out of bound of [0, 2pi]! "
                             << "Kphi_idx = " << Kphi_idx;
                    messager.flush("warning");
                    continue;
                }
                if (number_of_pairs_numerator_KTKphidiff[Kperp_idx][Kphi_idx]
                    > needed_number_of_pairs) {
                    continue;
                }
                number_of_pairs_numerator_KTKphidiff[Kperp_idx][Kphi_idx]++;
            }

            double cos_qx = cos(
                hbarC_inv
                * (q_E * t_diff - q_x * x_diff - q_y * y_diff - q_z * z_diff));

            // bin results
            if (azimuthal_flag_ == 0) {
                correl_3d_num_count[Kperp_idx][qout_idx][qside_idx]
                                   [qlong_idx]++;
                q_out_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_out;
                q_side_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_side;
                q_long_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_long;
                correl_3d_num[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    cos_qx;
            } else {
                correl_3d_Kphi_diff_num_count[Kperp_idx][Kphi_idx][qout_idx]
                                             [qside_idx][qlong_idx]++;
                q_out_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                               [qlong_idx] += local_q_out;
                q_side_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                                [qlong_idx] += local_q_side;
                q_long_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                                [qlong_idx] += local_q_long;
                correl_3d_Kphi_diff_num[Kperp_idx][Kphi_idx][qout_idx]
                                       [qside_idx][qlong_idx] += cos_qx;
            }
        }
    }
    temp_particle_list.clear();
}